

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O3

void __thiscall
backward::Printer::print_snippet
          (Printer *this,ostream *os,char *indent,SourceLoc *source_loc,Colorize *colorize,
          type color_code,int context_size)

{
  uint uVar1;
  SourceFile *this_00;
  size_t sVar2;
  ostream *poVar3;
  pointer ppVar4;
  char *pcVar5;
  lines_t lines;
  lines_t local_48;
  
  uVar1 = source_loc->line;
  this_00 = SnippetFactory::get_src_file(&this->_snippets,&source_loc->filename);
  SourceFile::get_lines_abi_cxx11_(&local_48,this_00,uVar1 - ((uint)context_size >> 1),context_size)
  ;
  ppVar4 = local_48.
           super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (ppVar4->first == source_loc->line) {
        Colorize::set_color(colorize,color_code);
        if (indent == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
          pcVar5 = ">";
        }
        else {
          sVar2 = strlen(indent);
          std::__ostream_insert<char,std::char_traits<char>>(os,indent,sVar2);
          pcVar5 = ">";
        }
      }
      else if (indent == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
        pcVar5 = " ";
      }
      else {
        sVar2 = strlen(indent);
        std::__ostream_insert<char,std::char_traits<char>>(os,indent,sVar2);
        pcVar5 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,1);
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 4;
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(ppVar4->second)._M_dataplus._M_p,(ppVar4->second)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (ppVar4->first == source_loc->line) {
        Colorize::set_color(colorize,reset);
      }
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != local_48.
                       super__Vector_base<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void print_snippet(std::ostream &os, const char *indent,
                     const ResolvedTrace::SourceLoc &source_loc,
                     Colorize &colorize, Color::type color_code,
                     int context_size) {
    using namespace std;
    typedef SnippetFactory::lines_t lines_t;

    lines_t lines = _snippets.get_snippet(source_loc.filename, source_loc.line,
                                          static_cast<unsigned>(context_size));

    for (lines_t::const_iterator it = lines.begin(); it != lines.end(); ++it) {
      if (it->first == source_loc.line) {
        colorize.set_color(color_code);
        os << indent << ">";
      } else {
        os << indent << " ";
      }
      os << std::setw(4) << it->first << ": " << it->second << "\n";
      if (it->first == source_loc.line) {
        colorize.set_color(Color::reset);
      }
    }
  }